

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

string * __thiscall
wabt::(anonymous_namespace)::CWriter::Mangle_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view name,bool double_underscores)

{
  uint8_t ch_00;
  bool bVar1;
  uint8_t *puVar2;
  char *pcVar3;
  const_iterator pvVar4;
  uint8_t *puStack_60;
  uint8_t ch;
  const_iterator it;
  anon_class_16_2_9228a5e7 append_verbatim;
  anon_class_24_3_c371f76a append_escaped;
  uint local_28;
  bool last_was_underscore;
  State state;
  bool double_underscores_local;
  string_view name_local;
  string *result;
  
  name_local._M_len = name._M_len;
  last_was_underscore = (bool)((byte)name._M_str & 1);
  local_28 = 0;
  append_escaped.state._7_1_ = 0;
  append_escaped.state._6_1_ = 0;
  _state = this;
  name_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  append_escaped.result = (string *)((long)&append_escaped.state + 7);
  append_escaped.last_was_underscore = (bool *)&local_28;
  append_verbatim.result = (string *)((long)&append_escaped.state + 7);
  it = (const_iterator)__return_storage_ptr__;
  append_verbatim.last_was_underscore = (bool *)__return_storage_ptr__;
  puStack_60 = (uint8_t *)
               std::basic_string_view<char,_std::char_traits<char>_>::begin
                         ((basic_string_view<char,_std::char_traits<char>_> *)&state);
  do {
    puVar2 = (uint8_t *)
             std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)&state);
    if (puStack_60 == puVar2) {
      return __return_storage_ptr__;
    }
    ch_00 = *puStack_60;
    switch(local_28) {
    case 0:
      local_28 = (uint)(ch_00 == '0');
      break;
    case 1:
      local_28 = 0;
      if (ch_00 == 'x') {
        local_28 = 2;
      }
      break;
    case 2:
      bVar1 = anon_unknown_0::internal_ishexdigit(ch_00);
      local_28 = 0;
      if (bVar1) {
        local_28 = 3;
      }
      break;
    case 3:
      abort();
    }
    if (local_28 == 3) {
      anon_unknown_0::CWriter::Mangle::anon_class_24_3_c371f76a::operator()
                ((anon_class_24_3_c371f76a *)&append_verbatim.last_was_underscore,ch_00);
    }
    else if (ch_00 == '_') {
      puVar2 = (uint8_t *)
               std::basic_string_view<char,_std::char_traits<char>_>::begin
                         ((basic_string_view<char,_std::char_traits<char>_> *)&state);
      if (puStack_60 != puVar2) {
        pcVar3 = std::next<char_const*>((char *)puStack_60,1);
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end
                           ((basic_string_view<char,_std::char_traits<char>_> *)&state);
        if ((pcVar3 != pvVar4) && ((append_escaped.state._7_1_ & 1) == 0)) goto LAB_001c231d;
      }
      anon_unknown_0::CWriter::Mangle::anon_class_24_3_c371f76a::operator()
                ((anon_class_24_3_c371f76a *)&append_verbatim.last_was_underscore,'_');
    }
    else {
LAB_001c231d:
      if (((last_was_underscore & 1U) == 0) || (ch_00 != '_')) {
        bVar1 = anon_unknown_0::internal_isalnum(ch_00);
        if ((bVar1) || (ch_00 == '_')) {
          anon_unknown_0::CWriter::Mangle::anon_class_16_2_9228a5e7::operator()
                    ((anon_class_16_2_9228a5e7 *)&it,ch_00);
        }
        else {
          anon_unknown_0::CWriter::Mangle::anon_class_24_3_c371f76a::operator()
                    ((anon_class_24_3_c371f76a *)&append_verbatim.last_was_underscore,ch_00);
        }
      }
      else {
        anon_unknown_0::CWriter::Mangle::anon_class_16_2_9228a5e7::operator()
                  ((anon_class_16_2_9228a5e7 *)&it,'_');
        anon_unknown_0::CWriter::Mangle::anon_class_16_2_9228a5e7::operator()
                  ((anon_class_16_2_9228a5e7 *)&it,'_');
      }
    }
    puStack_60 = puStack_60 + 1;
  } while( true );
}

Assistant:

std::string CWriter::Mangle(std::string_view name, bool double_underscores) {
  /*
   * Name mangling transforms arbitrary Wasm names into "safe" C names
   * in a deterministic way. To avoid collisions, distinct Wasm names must be
   * transformed into distinct C names.
   *
   * The rules implemented here are:
   * 1) any hex digit ('A' through 'F') that follows the sequence "0x"
   *    is escaped
   * 2) any underscore at the beginning, at the end, or following another
   *    underscore, is escaped
   * 3) if double_underscores is set, underscores are replaced with
   *    two underscores.
   * 4) otherwise, any alphanumeric character is kept as-is,
   *    and any other character is escaped
   *
   * "Escaped" means the character is represented with the sequence "0xAB",
   * where A B are hex digits ('0'-'9' or 'A'-'F') representing the character's
   * numeric value.
   *
   * Module names are mangled with double_underscores=true to prevent
   * collisions between, e.g., a module "alfa" with export
   * "bravo_charlie" vs. a module "alfa_bravo" with export "charlie".
   */

  enum State { Any, Zero, ZeroX, ZeroXHexDigit } state{Any};
  bool last_was_underscore = false;

  std::string result;
  auto append_escaped = [&](const uint8_t ch) {
    result += "0x" + StringPrintf("%02X", ch);
    last_was_underscore = false;
    state = Any;
  };

  auto append_verbatim = [&](const uint8_t ch) {
    result += ch;
    last_was_underscore = (ch == '_');
  };

  for (auto it = name.begin(); it != name.end(); ++it) {
    const uint8_t ch = *it;
    switch (state) {
      case Any:
        state = (ch == '0') ? Zero : Any;
        break;
      case Zero:
        state = (ch == 'x') ? ZeroX : Any;
        break;
      case ZeroX:
        state = internal_ishexdigit(ch) ? ZeroXHexDigit : Any;
        break;
      case ZeroXHexDigit:
        WABT_UNREACHABLE;
        break;
    }

    /* rule 1 */
    if (state == ZeroXHexDigit) {
      append_escaped(ch);
      continue;
    }

    /* rule 2 */
    if ((ch == '_') && ((it == name.begin()) || (std::next(it) == name.end()) ||
                        last_was_underscore)) {
      append_escaped(ch);
      continue;
    }

    /* rule 3 */
    if (double_underscores && ch == '_') {
      append_verbatim(ch);
      append_verbatim(ch);
      continue;
    }

    /* rule 4 */
    if (internal_isalnum(ch) || (ch == '_')) {
      append_verbatim(ch);
    } else {
      append_escaped(ch);
    }
  }

  return result;
}